

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O2

int dosave0(boolean emergency)

{
  int fd;
  boolean bVar1;
  memfile mf;
  
  bVar1 = iflags.disable_log;
  mnew(&mf,(memfile *)0x0);
  fd = logfile;
  iflags.disable_log = '\0';
  log_finish(LS_SAVED);
  iflags.disable_log = bVar1;
  vision_recalc(2);
  savegame(&mf);
  store_mf(fd,&mf);
  freedynamicdata();
  return 1;
}

Assistant:

int dosave0(boolean emergency)
{
	int fd;
	struct memfile mf;
	boolean log_disabled = iflags.disable_log;

	mnew(&mf, NULL);

	fd = logfile;

	/* when  we leave via nh_exit, logging is disabled. It needs to be
	 * enabled briefly so that log_finish will update the log header. */
	iflags.disable_log = FALSE;
	log_finish(LS_SAVED);
	iflags.disable_log = log_disabled;
	vision_recalc(2);	/* shut down vision to prevent problems
				   in the event of an impossible() call */

	savegame(&mf);
	store_mf(fd, &mf);	/* also frees mf */

	freedynamicdata();

	return TRUE;
}